

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NussinovAlgorithm.cpp
# Opt level: O2

int __thiscall NussinovAlgorithm::get_nbp(NussinovAlgorithm *this,int i,int j)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  string bp;
  string local_28;
  
  get_bp_abi_cxx11_(&local_28,this,i,j);
  uVar2 = 0;
  uVar1 = (ulong)(uint)local_28._M_string_length;
  if ((int)(uint)local_28._M_string_length < 1) {
    uVar1 = uVar2;
  }
  iVar3 = 0;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    iVar3 = iVar3 + (uint)(local_28._M_dataplus._M_p[uVar2] == '(');
  }
  std::__cxx11::string::~string((string *)&local_28);
  return iVar3;
}

Assistant:

int NussinovAlgorithm::get_nbp(int i, int j) {
    string bp = get_bp(i,j);
    int count = 0;
    for (int k = 0; k < (int)bp.size(); k++) {
        if (bp[k] == '(') count++;
    }
    return count;
}